

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrtInfo.cpp
# Opt level: O2

void __thiscall pbrt::semantic::PBRTInfo::traverse(PBRTInfo *this,SP *object)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  element_type *peVar3;
  __shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  iterator iVar8;
  long lVar9;
  ostream *poVar10;
  iterator __begin2;
  __shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  __shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *p_Var12;
  __shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> *p_Var13;
  shared_ptr<pbrt::Shape> shape;
  iterator __end2;
  shared_ptr<pbrt::LightSource> light;
  SP curves;
  SP disk;
  SP sphere;
  SP mesh_1;
  SP mesh;
  __shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  iVar8 = std::
          _Rb_tree<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::_Identity<std::shared_ptr<pbrt::Object>_>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::shared_ptr<pbrt::Object>_>_>
          ::find(&(this->alreadyTraversed)._M_t,object);
  p_Var2 = &(this->alreadyTraversed)._M_t._M_impl.super__Rb_tree_header;
  std::
  _Rb_tree<std::shared_ptr<pbrt::Object>,std::shared_ptr<pbrt::Object>,std::_Identity<std::shared_ptr<pbrt::Object>>,std::less<std::shared_ptr<pbrt::Object>>,std::allocator<std::shared_ptr<pbrt::Object>>>
  ::_M_insert_unique<std::shared_ptr<pbrt::Object>const&>
            ((_Rb_tree<std::shared_ptr<pbrt::Object>,std::shared_ptr<pbrt::Object>,std::_Identity<std::shared_ptr<pbrt::Object>>,std::less<std::shared_ptr<pbrt::Object>>,std::allocator<std::shared_ptr<pbrt::Object>>>
              *)&this->alreadyTraversed,object);
  psVar1 = &(this->numObjects).instanced;
  *psVar1 = *psVar1 + 1;
  if ((_Rb_tree_header *)iVar8._M_node == p_Var2) {
    (this->numObjects).unique = (this->numObjects).unique + 1;
  }
  peVar3 = (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var11 = &((peVar3->lightSources).
              super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
  p_Var4 = &((peVar3->lightSources).
             super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>;
  lVar9 = (long)p_Var4 - (long)p_Var11 >> 4;
  psVar1 = &(this->numLights).instanced;
  *psVar1 = *psVar1 + lVar9;
  if ((_Rb_tree_header *)iVar8._M_node == p_Var2) {
    (this->numLights).unique = (this->numLights).unique + lVar9;
  }
  for (; p_Var11 != p_Var4; p_Var11 = p_Var11 + 1) {
    std::__shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&light.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>,p_Var11);
    Entity::as<pbrt::PointLightSource>((Entity *)&shape);
    peVar7 = shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((peVar7 != (element_type *)0x0) &&
       (psVar1 = &(this->numPointLights).instanced, *psVar1 = *psVar1 + 1,
       (_Rb_tree_header *)iVar8._M_node == p_Var2)) {
      (this->numPointLights).unique = (this->numPointLights).unique + 1;
    }
    Entity::as<pbrt::SpotLightSource>((Entity *)&shape);
    peVar7 = shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((peVar7 != (element_type *)0x0) &&
       (psVar1 = &(this->numSpotLights).instanced, *psVar1 = *psVar1 + 1,
       (_Rb_tree_header *)iVar8._M_node == p_Var2)) {
      (this->numSpotLights).unique = (this->numSpotLights).unique + 1;
    }
    Entity::as<pbrt::InfiniteLightSource>((Entity *)&shape);
    peVar7 = shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((peVar7 != (element_type *)0x0) &&
       (psVar1 = &(this->numInfiniteLights).instanced, *psVar1 = *psVar1 + 1,
       (_Rb_tree_header *)iVar8._M_node == p_Var2)) {
      (this->numInfiniteLights).unique = (this->numInfiniteLights).unique + 1;
    }
    Entity::as<pbrt::DistantLightSource>((Entity *)&shape);
    peVar7 = shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((peVar7 != (element_type *)0x0) &&
       (psVar1 = &(this->numDistantLights).instanced, *psVar1 = *psVar1 + 1,
       (_Rb_tree_header *)iVar8._M_node == p_Var2)) {
      (this->numDistantLights).unique = (this->numDistantLights).unique + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&light.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  peVar3 = (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var12 = &((peVar3->shapes).
              super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
  p_Var5 = &((peVar3->shapes).
             super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
  lVar9 = (long)p_Var5 - (long)p_Var12 >> 4;
  psVar1 = &(this->numShapes).instanced;
  *psVar1 = *psVar1 + lVar9;
  if ((_Rb_tree_header *)iVar8._M_node == p_Var2) {
    (this->numShapes).unique = (this->numShapes).unique + lVar9;
  }
  for (; p_Var12 != p_Var5; p_Var12 = p_Var12 + 1) {
    std::__shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>,p_Var12);
    std::
    _Rb_tree<std::shared_ptr<pbrt::Material>,std::shared_ptr<pbrt::Material>,std::_Identity<std::shared_ptr<pbrt::Material>>,std::less<std::shared_ptr<pbrt::Material>>,std::allocator<std::shared_ptr<pbrt::Material>>>
    ::_M_insert_unique<std::shared_ptr<pbrt::Material>const&>
              ((_Rb_tree<std::shared_ptr<pbrt::Material>,std::shared_ptr<pbrt::Material>,std::_Identity<std::shared_ptr<pbrt::Material>>,std::less<std::shared_ptr<pbrt::Material>>,std::allocator<std::shared_ptr<pbrt::Material>>>
                *)&this->usedMaterials,
               &(shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->material
              );
    if ((((shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->areaLight).
         super___shared_ptr<pbrt::AreaLight,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) &&
       (psVar1 = &(this->numAreaLights).instanced, *psVar1 = *psVar1 + 1,
       (_Rb_tree_header *)iVar8._M_node == p_Var2)) {
      (this->numAreaLights).unique = (this->numAreaLights).unique + 1;
    }
    std::dynamic_pointer_cast<pbrt::TriangleMesh,pbrt::Shape>((shared_ptr<pbrt::Shape> *)&mesh);
    if (mesh.super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::dynamic_pointer_cast<pbrt::QuadMesh,pbrt::Shape>((shared_ptr<pbrt::Shape> *)&mesh_1);
      if (mesh_1.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::dynamic_pointer_cast<pbrt::Sphere,pbrt::Shape>((shared_ptr<pbrt::Shape> *)&sphere);
        if (sphere.super___shared_ptr<pbrt::Sphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::dynamic_pointer_cast<pbrt::Disk,pbrt::Shape>((shared_ptr<pbrt::Shape> *)&disk);
          if (disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::dynamic_pointer_cast<pbrt::Curve,pbrt::Shape>((shared_ptr<pbrt::Shape> *)&curves);
            if (curves.super___shared_ptr<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              poVar10 = std::operator<<((ostream *)&std::cout,"un-handled geometry type : ");
              (**((shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super_Entity)._vptr_Entity)((string *)&light);
              poVar10 = std::operator<<(poVar10,(string *)&light);
              std::endl<char,std::char_traits<char>>(poVar10);
              std::__cxx11::string::~string((string *)&light);
            }
            else {
              psVar1 = &(this->numCurves).instanced;
              *psVar1 = *psVar1 + 1;
              if ((_Rb_tree_header *)iVar8._M_node == p_Var2) {
                (this->numCurves).unique = (this->numCurves).unique + 1;
              }
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&curves.super___shared_ptr<pbrt::Curve,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          else {
            psVar1 = &(this->numDisks).instanced;
            *psVar1 = *psVar1 + 1;
            if ((_Rb_tree_header *)iVar8._M_node == p_Var2) {
              (this->numDisks).unique = (this->numDisks).unique + 1;
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&disk.super___shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        else {
          psVar1 = &(this->numSpheres).instanced;
          *psVar1 = *psVar1 + 1;
          if ((_Rb_tree_header *)iVar8._M_node == p_Var2) {
            (this->numSpheres).unique = (this->numSpheres).unique + 1;
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&sphere.super___shared_ptr<pbrt::Sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
      }
      else {
        lVar9 = (long)((mesh_1.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->index).
                      super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)((mesh_1.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->index).
                      super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4;
        psVar1 = &(this->numQuads).instanced;
        *psVar1 = *psVar1 + lVar9;
        if ((_Rb_tree_header *)iVar8._M_node == p_Var2) {
          (this->numQuads).unique = (this->numQuads).unique + lVar9;
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mesh_1.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    else {
      lVar9 = ((long)((mesh.super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->index).
                     super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)((mesh.super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )->index).
                    super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0xc;
      psVar1 = &(this->numTriangles).instanced;
      *psVar1 = *psVar1 + lVar9;
      if ((_Rb_tree_header *)iVar8._M_node == p_Var2) {
        (this->numTriangles).unique = (this->numTriangles).unique + lVar9;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mesh.super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&shape.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  peVar3 = (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var13 = &((peVar3->instances).
              super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>;
  p_Var6 = &((peVar3->instances).
             super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>;
  lVar9 = (long)p_Var6 - (long)p_Var13 >> 4;
  psVar1 = &(this->numInstances).instanced;
  *psVar1 = *psVar1 + lVar9;
  if ((_Rb_tree_header *)iVar8._M_node == p_Var2) {
    (this->numInstances).unique = (this->numInstances).unique + lVar9;
  }
  for (; p_Var13 != p_Var6; p_Var13 = p_Var13 + 1) {
    std::__shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> *)&light,p_Var13);
    std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)
               (light.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1))
    ;
    traverse(this,(SP *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&light.super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  return;
}

Assistant:

void traverse(Object::SP object)
      {
        const bool firstTime = (alreadyTraversed.find(object) == alreadyTraversed.end());
        alreadyTraversed.insert(object);
 
        numObjects.add(firstTime,1);
        numLights.add(firstTime,object->lightSources.size());

        for (auto light : object->lightSources) {
          if (light->as<PointLightSource>())
            numPointLights.add(firstTime,1);
          if (light->as<SpotLightSource>())
            numSpotLights.add(firstTime,1);
          if (light->as<InfiniteLightSource>())
            numInfiniteLights.add(firstTime,1);
          if (light->as<DistantLightSource>())
            numDistantLights.add(firstTime,1);
        }
        
        numShapes.add(firstTime,object->shapes.size());
        
        for (auto shape : object->shapes) {
          usedMaterials.insert(shape->material);
          if (shape->areaLight) {
            numAreaLights.add(firstTime,1);
          }
          if (TriangleMesh::SP mesh=std::dynamic_pointer_cast<TriangleMesh>(shape)){
            numTriangles.add(firstTime,mesh->index.size());
          } else if (QuadMesh::SP mesh=std::dynamic_pointer_cast<QuadMesh>(shape)){
            numQuads.add(firstTime,mesh->index.size());
          } else if (Sphere::SP sphere=std::dynamic_pointer_cast<Sphere>(shape)){
            numSpheres.add(firstTime,1);
          } else if (Disk::SP disk=std::dynamic_pointer_cast<Disk>(shape)){
            numDisks.add(firstTime,1);
          } else if (Curve::SP curves=std::dynamic_pointer_cast<Curve>(shape)){
            numCurves.add(firstTime,1);
          } else
            std::cout << "un-handled geometry type : " << shape->toString() << std::endl;
        }

        numInstances.add(firstTime,object->instances.size());
        for (auto inst : object->instances) {
          traverse(inst->object);
        }
      }